

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset.cpp
# Opt level: O1

void __thiscall
icu_63::UnicodeSet::UnicodeSet
          (UnicodeSet *this,uint16_t *data,int32_t dataLen,ESerialization serialization,
          UErrorCode *ec)

{
  int iVar1;
  ushort uVar2;
  uint uVar3;
  UChar32 *pUVar4;
  ushort uVar5;
  int iVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  
  (this->super_UnicodeFilter).super_UnicodeFunctor.super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeSet_00401a28;
  (this->super_UnicodeFilter).super_UnicodeMatcher._vptr_UnicodeMatcher =
       (_func_int **)&PTR__UnicodeSet_00401b40;
  this->len = 1;
  this->capacity = 0x11;
  this->list = (UChar32 *)0x0;
  this->bmpSet = (BMPSet *)0x0;
  this->buffer = (UChar32 *)0x0;
  this->bufferCapacity = 0;
  this->patLen = 0;
  this->pat = (char16_t *)0x0;
  this->strings = (UVector *)0x0;
  *(undefined8 *)((long)&this->strings + 1) = 0;
  *(undefined8 *)((long)&this->stringSpan + 1) = 0;
  if (*ec < U_ILLEGAL_ARGUMENT_ERROR) {
    if (((dataLen < 1) || (data == (uint16_t *)0x0)) || (serialization != kSerialized)) {
      *ec = U_ILLEGAL_ARGUMENT_ERROR;
      clear(this);
    }
    else {
      allocateStrings(this,ec);
      if (*ec < U_ILLEGAL_ARGUMENT_ERROR) {
        uVar2 = *data;
        uVar5 = uVar2;
        if ((short)uVar2 < 0) {
          uVar5 = data[1];
        }
        uVar11 = (uint)uVar5;
        iVar6 = (int)((uVar2 & 0x7fff) - (uint)uVar5) / 2;
        iVar1 = iVar6 + uVar11;
        this->len = iVar1;
        this->capacity = iVar6 + (uint)uVar5 + 1;
        pUVar4 = (UChar32 *)uprv_malloc_63((long)iVar1 * 4 + 4);
        this->list = pUVar4;
        if ((pUVar4 != (UChar32 *)0x0) && (*ec < U_ILLEGAL_ARGUMENT_ERROR)) {
          uVar10 = ((short)uVar2 < 0) + 1;
          uVar7 = (ulong)uVar11;
          if (uVar5 != 0) {
            uVar9 = 0;
            do {
              pUVar4[uVar9] = (uint)data[uVar10 + uVar9];
              uVar9 = uVar9 + 1;
            } while (uVar7 != uVar9);
          }
          uVar3 = this->len;
          if ((int)uVar11 < (int)uVar3) {
            uVar10 = uVar10 + uVar11;
            lVar8 = 0;
            do {
              pUVar4[uVar7 + lVar8] =
                   CONCAT22(data[(ulong)uVar10 + lVar8 * 2],data[(ulong)uVar10 + lVar8 * 2 + 1]);
              lVar8 = lVar8 + 1;
            } while (uVar3 - uVar7 != lVar8);
          }
          this->len = uVar3 + 1;
          pUVar4[(int)uVar3] = 0x110000;
          return;
        }
        clear(this);
      }
      else {
        clear(this);
      }
    }
  }
  else {
    clear(this);
  }
  this->fFlags = '\x01';
  return;
}

Assistant:

UnicodeSet::UnicodeSet(const uint16_t data[], int32_t dataLen, ESerialization serialization, UErrorCode &ec)
  : len(1), capacity(1+START_EXTRA), list(0), bmpSet(0), buffer(0),
    bufferCapacity(0), patLen(0), pat(NULL), strings(NULL), stringSpan(NULL),
    fFlags(0) {

  if(U_FAILURE(ec)) {
    setToBogus();
    return;
  }

  if( (serialization != kSerialized)
      || (data==NULL)
      || (dataLen < 1)) {
    ec = U_ILLEGAL_ARGUMENT_ERROR;
    setToBogus();
    return;
  }

  allocateStrings(ec);
  if (U_FAILURE(ec)) {
    setToBogus();
    return;
  }

  // bmp?
  int32_t headerSize = ((data[0]&0x8000)) ?2:1;
  int32_t bmpLength = (headerSize==1)?data[0]:data[1];

  len = (((data[0]&0x7FFF)-bmpLength)/2)+bmpLength;
#ifdef DEBUG_SERIALIZE
  printf("dataLen %d headerSize %d bmpLen %d len %d. data[0]=%X/%X/%X/%X\n", dataLen,headerSize,bmpLength,len, data[0],data[1],data[2],data[3]);
#endif
  capacity = len+1;
  list = (UChar32*) uprv_malloc(sizeof(UChar32) * capacity);
  if(!list || U_FAILURE(ec)) {
    setToBogus();
    return;
  }
  // copy bmp
  int32_t i;
  for(i = 0; i< bmpLength;i++) {
    list[i] = data[i+headerSize];
#ifdef DEBUG_SERIALIZE
    printf("<<16@%d[%d] %X\n", i+headerSize, i, list[i]);
#endif
  }
  // copy smp
  for(i=bmpLength;i<len;i++) {
    list[i] = ((UChar32)data[headerSize+bmpLength+(i-bmpLength)*2+0] << 16) +
              ((UChar32)data[headerSize+bmpLength+(i-bmpLength)*2+1]);
#ifdef DEBUG_SERIALIZE
    printf("<<32@%d+[%d] %lX\n", headerSize+bmpLength+i, i, list[i]);
#endif
  }
  // terminator
  list[len++]=UNICODESET_HIGH;
}